

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void __thiscall
kratos::PipelineInsertionVisitor::visit(PipelineInsertionVisitor *this,Generator *generator)

{
  allocator<kratos::IRNode_*> *this_00;
  pointer *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_02;
  uint32_t width;
  initializer_list<kratos::IRNode_*> __l;
  IRNode *pIVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> prefix;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  PortDirection PVar5;
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  *__x;
  __shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_03;
  element_type *peVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar7;
  ulong uVar8;
  reference pvVar9;
  reference pvVar10;
  __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var11;
  element_type *peVar12;
  element_type *peVar13;
  uint32_t *puVar14;
  bool *pbVar15;
  reference pvVar16;
  element_type *var_00;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *this_04;
  element_type *new_var;
  element_type *var_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RCX;
  char (*extraout_RDX) [10];
  char (*format_str) [10];
  char (*extraout_RDX_00) [10];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar17 [16];
  pair<const_char_*,_int> pVar18;
  basic_string_view<char> bVar19;
  format_args args;
  format_args args_00;
  string_view format_str_00;
  string_view format_str_01;
  undefined1 local_4b8 [32];
  undefined1 local_498 [32];
  undefined1 local_478 [8];
  value_type next_stage;
  value_type pre_stage;
  undefined1 local_450 [4];
  uint32_t i_3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_440;
  uint32_t local_438;
  int local_42c;
  pair<const_char_*,_int> local_428;
  Var *local_418;
  Var *var;
  undefined1 local_3f0 [8];
  string new_name;
  undefined1 local_3c8 [4];
  uint32_t i_2;
  vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_> vars;
  undefined1 local_3a8 [8];
  shared_ptr<kratos::Port> port;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *port_name;
  iterator __end3;
  iterator __begin3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  int local_364;
  pair<const_char_*,_int> local_360;
  EventEdgeType local_34c;
  pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> local_348;
  shared_ptr<kratos::Stmt> local_330;
  shared_ptr<kratos::SequentialStmtBlock> local_320;
  uint local_30c;
  undefined1 local_308 [4];
  uint32_t i_1;
  vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
  blocks;
  shared_ptr<kratos::Port> clock_port;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2d8;
  undefined1 local_2c8 [32];
  string local_2a8;
  undefined1 local_288 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  clock_names;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  invalid_argument *anon_var_0;
  int i;
  shared_ptr<kratos::Attribute> *attr;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  *__range2;
  uint32_t num_stages;
  undefined1 local_1d8 [8];
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  attributes;
  string clock_name;
  bool has_attribute;
  Generator *generator_local;
  PipelineInsertionVisitor *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_180;
  _Prime_rehash_policy local_178;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_168;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_150;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_1;
  char *local_140;
  __node_base local_138;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_130;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_128;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_120;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_118;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_110;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_88;
  basic_string_view<char> local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int>
  *local_68 [3];
  _Base_ptr local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int>
  *vargs_2;
  _Base_ptr local_40;
  _Base_ptr local_38;
  _Base_ptr local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  _Base_ptr local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  _Base_ptr local_10;
  
  bVar3 = false;
  std::__cxx11::string::string
            ((string *)
             &attributes.
              super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __x = IRNode::get_attributes(&generator->super_IRNode);
  std::
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>::
  vector((vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
          *)local_1d8,__x);
  __range2._0_4_ = 0;
  __end2 = std::
           vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ::begin((vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                    *)local_1d8);
  attr = (shared_ptr<kratos::Attribute> *)
         std::
         vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
         ::end((vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                *)local_1d8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
                                *)&attr);
    if (!bVar2) break;
    this_03 = (__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
              ::operator*(&__end2);
    peVar6 = std::__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(this_03);
    bVar2 = std::operator==(&peVar6->type_str,"pipeline");
    if (bVar2) {
      peVar6 = std::__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_03);
      uVar4 = std::__cxx11::stoi(&peVar6->value_str,(size_t *)0x0,10);
      if (0 < (int)uVar4) {
        bVar3 = true;
        __range2._0_4_ = uVar4;
      }
    }
    else {
      peVar6 = std::__shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_03);
      bVar2 = std::operator==(&peVar6->type_str,"pipeline_clk");
      if (bVar2) {
        peVar6 = std::
                 __shared_ptr_access<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_03);
        std::__cxx11::string::operator=
                  ((string *)
                   &attributes.
                    super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&peVar6->value_str)
        ;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
    ::operator++(&__end2);
  }
  if (bVar3) {
    psVar7 = Generator::get_port_names_abi_cxx11_(generator);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&clock_names.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar7);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) != 0) {
      Generator::get_ports_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_288,generator,Clock);
      bVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_288);
      if (!bVar3) {
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_288,0);
        std::__cxx11::string::operator=
                  ((string *)
                   &attributes.
                    super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar9);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_288);
    }
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) != 0) {
      clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _6_1_ = 1;
      auVar17 = __cxa_allocate_exception(0x10);
      vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&generator->name;
      local_138._M_nxt = (_Hash_node_base *)&local_2a8;
      local_140 = "Unable to find clock signal for generator {0}";
      local_168.named_args.data =
           (named_arg_info<char> *)
           fmt::v7::make_args_checked<std::__cxx11::string&,char[46],char>
                     ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)"Unable to find clock signal for generator {0}",(v7 *)vargs_1,auVar17._8_8_
                      ,(remove_reference_t<std::__cxx11::basic_string<char>_&> *)
                       "Unable to find clock signal for generator {0}");
      local_150 = &local_168;
      local_178 = (_Prime_rehash_policy)fmt::v7::to_string_view<char,_0>(local_140);
      local_128 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                   *)&this_local;
      local_130 = local_150;
      local_120 = local_150;
      local_110 = local_150;
      local_118 = local_128;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_128,0xd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)&local_150->string);
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_180.values_;
      format_str_00.size_ = (size_t)this_local;
      format_str_00.data_ = (char *)local_178._M_next_resize;
      fmt::v7::detail::vformat_abi_cxx11_(&local_2a8,(detail *)local_178._0_8_,format_str_00,args);
      local_2d8._8_8_ = &local_2d8;
      local_2c8._0_8_ = (pointer)0x1;
      this_00 = (allocator<kratos::IRNode_*> *)
                ((long)&clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 7);
      local_2d8._M_allocated_capacity = (size_type)generator;
      std::allocator<kratos::IRNode_*>::allocator(this_00);
      __l._M_len = local_2c8._0_8_;
      __l._M_array = (iterator)local_2d8._8_8_;
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)(local_2c8 + 8),__l,
                 this_00);
      GeneratorException::GeneratorException
                (auVar17._0_8_,&local_2a8,
                 (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)(local_2c8 + 8));
      clock_port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _6_1_ = 0;
      __cxa_throw(auVar17._0_8_,&GeneratorException::typeinfo,
                  GeneratorException::~GeneratorException);
    }
    Generator::get_port((Generator *)
                        &blocks.
                         super__Vector_base<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)generator);
    std::
    vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
    ::vector((vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
              *)local_308);
    std::
    vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
    ::resize((vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
              *)local_308,(ulong)(uint)__range2);
    for (local_30c = 0; local_30c < (uint)__range2; local_30c = local_30c + 1) {
      std::make_shared<kratos::SequentialStmtBlock>();
      pvVar10 = std::
                vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
                ::operator[]((vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
                              *)local_308,(ulong)local_30c);
      std::shared_ptr<kratos::SequentialStmtBlock>::operator=(pvVar10,&local_320);
      std::shared_ptr<kratos::SequentialStmtBlock>::~shared_ptr(&local_320);
      pvVar10 = std::
                vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
                ::operator[]((vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
                              *)local_308,(ulong)local_30c);
      std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::SequentialStmtBlock,void>
                (&local_330,pvVar10);
      Generator::add_stmt(generator,&local_330);
      std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_330);
      p_Var11 = (__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::
                   vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
                   ::operator[]((vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
                                 *)local_308,(ulong)local_30c);
      peVar12 = std::
                __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var11);
      local_34c = Posedge;
      std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::
      pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Port>_&,_true>
                (&local_348,&local_34c,
                 (shared_ptr<kratos::Port> *)
                 &blocks.
                  super__Vector_base<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      SequentialStmtBlock::add_condition(peVar12,&local_348);
      std::pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_>::~pair(&local_348);
      if ((generator->debug & 1U) != 0) {
        p_Var11 = (__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
                     ::operator[]((vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
                                   *)local_308,(ulong)local_30c);
        peVar12 = std::
                  __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var11);
        local_364 = 0x242;
        pVar18 = std::make_pair<char_const(&)[81],int>
                           ((char (*) [81])
                            "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/optimize.cc"
                            ,&local_364);
        in_RCX = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar18.first;
        local_360.second = pVar18.second;
        local_360.first = (char *)in_RCX;
        std::
        vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
        ::emplace_back<std::pair<char_const*,int>>
                  ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                    *)&(peVar12->super_StmtBlock).super_Stmt.super_IRNode.fn_name_ln,&local_360);
      }
    }
    this_01 = &clock_names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end3 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_01);
    port_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_01);
    while( true ) {
      bVar3 = std::operator!=(&__end3,(_Self *)&port_name);
      if (!bVar3) break;
      port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::
           _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&__end3);
      Generator::get_port((Generator *)local_3a8,(string *)generator);
      peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_3a8);
      PVar5 = Port::port_direction(peVar13);
      if (PVar5 == In) {
        vars.
        super__Vector_base<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 8;
      }
      else {
        std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::
        vector((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                *)local_3c8);
        std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::
        resize((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                *)local_3c8,(ulong)(uint)__range2);
        format_str = extraout_RDX;
        for (new_name.field_2._12_4_ = 0;
            prefix._M_pi = port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi, (uint)new_name.field_2._12_4_ < (uint)__range2;
            new_name.field_2._12_4_ = new_name.field_2._12_4_ + 1) {
          local_38 = (_Base_ptr)&var;
          local_40 = (_Base_ptr)0x43b480;
          vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int>
                     *)((long)&new_name.field_2 + 0xc);
          local_68[0] = fmt::v7::make_args_checked<unsigned_int&,char[10],char>
                                  ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_unsigned_int>
                                    *)"stage_{0}",(v7 *)vargs_2,format_str,
                                   (remove_reference_t<unsigned_int_&> *)in_RCX);
          local_50 = (_Base_ptr)local_68;
          bVar19 = fmt::v7::to_string_view<char,_0>((char *)local_40);
          local_28 = &local_88;
          local_30 = local_50;
          local_20 = local_50;
          local_10 = local_50;
          local_18 = local_28;
          local_78 = bVar19;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_28,2,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_50);
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_88.field_1.values_;
          format_str_01.size_ = local_88.desc_;
          format_str_01.data_ = (char *)local_78.size_;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)&var,(detail *)local_78.data_,format_str_01,args_00);
          Generator::get_unique_variable_name
                    ((string *)local_3f0,generator,(string *)prefix._M_pi,(string *)&var);
          std::__cxx11::string::~string((string *)&var);
          peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_3a8);
          puVar14 = Var::var_width(&peVar13->super_Var);
          width = *puVar14;
          peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_3a8);
          in_RCX = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Var::size(&peVar13->super_Var);
          peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_3a8);
          pbVar15 = Var::is_signed(&peVar13->super_Var);
          local_418 = Generator::var(generator,(string *)local_3f0,width,
                                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RCX,
                                     (bool)(*pbVar15 & 1));
          if ((generator->debug & 1U) != 0) {
            pIVar1 = &local_418->super_IRNode;
            local_42c = 0x252;
            pVar18 = std::make_pair<char_const(&)[81],int>
                               ((char (*) [81])
                                "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/optimize.cc"
                                ,&local_42c);
            in_RCX = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar18.first;
            local_438 = pVar18.second;
            local_440 = in_RCX;
            local_428.first = (char *)in_RCX;
            local_428.second = local_438;
            std::
            vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
            ::emplace_back<std::pair<char_const*,int>>
                      ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                        *)&pIVar1->fn_name_ln,&local_428);
          }
          std::enable_shared_from_this<kratos::Var>::shared_from_this
                    ((enable_shared_from_this<kratos::Var> *)local_450);
          pvVar16 = std::
                    vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                    ::operator[]((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                                  *)local_3c8,(ulong)(uint)new_name.field_2._12_4_);
          std::shared_ptr<kratos::Var>::operator=(pvVar16,(shared_ptr<kratos::Var> *)local_450);
          std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_450);
          std::__cxx11::string::~string((string *)local_3f0);
          format_str = extraout_RDX_00;
        }
        var_00 = std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)local_3a8);
        this_04 = &std::
                   vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                   ::operator[]((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                                 *)local_3c8,0)->
                   super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
        new_var = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(this_04);
        Var::move_src_to(&var_00->super_Var,new_var,generator,false);
        for (pre_stage.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             ._4_4_ = 0;
            pre_stage.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ < (uint)__range2 - 1;
            pre_stage.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ = pre_stage.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._4_4_ + 1) {
          pvVar16 = std::
                    vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                    ::operator[]((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                                  *)local_3c8,
                                 (ulong)pre_stage.
                                        super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount._M_pi._4_4_);
          this_02 = &next_stage.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
          std::shared_ptr<kratos::Var>::shared_ptr((shared_ptr<kratos::Var> *)this_02,pvVar16);
          pvVar16 = std::
                    vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                    ::operator[]((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                                  *)local_3c8,
                                 (ulong)(pre_stage.
                                         super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi._4_4_ + 1));
          std::shared_ptr<kratos::Var>::shared_ptr((shared_ptr<kratos::Var> *)local_478,pvVar16);
          p_Var11 = (__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)std::
                       vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
                       ::operator[]((vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
                                     *)local_308,
                                    (ulong)pre_stage.
                                           super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount._M_pi._4_4_);
          peVar12 = std::
                    __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var11);
          var_01 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_478);
          Var::assign((Var *)local_498,(shared_ptr<kratos::Var> *)var_01,(AssignmentType)this_02);
          std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                    ((shared_ptr<kratos::Stmt> *)(local_498 + 0x10),
                     (shared_ptr<kratos::AssignStmt> *)local_498);
          StmtBlock::add_stmt(&peVar12->super_StmtBlock,
                              (shared_ptr<kratos::Stmt> *)(local_498 + 0x10));
          std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_498 + 0x10))
          ;
          std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                    ((shared_ptr<kratos::AssignStmt> *)local_498);
          std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_478);
          std::shared_ptr<kratos::Var>::~shared_ptr
                    ((shared_ptr<kratos::Var> *)
                     &next_stage.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        p_Var11 = (__shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
                     ::operator[]((vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
                                   *)local_308,(ulong)((uint)__range2 - 1));
        peVar12 = std::
                  __shared_ptr_access<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var11);
        peVar13 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_3a8);
        pvVar16 = std::
                  vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                  ::operator[]((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                                *)local_3c8,(ulong)((uint)__range2 - 1));
        in_RCX = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
        Var::assign((Var *)local_4b8,(shared_ptr<kratos::Var> *)peVar13,(AssignmentType)pvVar16);
        std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
                  ((shared_ptr<kratos::Stmt> *)(local_4b8 + 0x10),
                   (shared_ptr<kratos::AssignStmt> *)local_4b8);
        StmtBlock::add_stmt(&peVar12->super_StmtBlock,(shared_ptr<kratos::Stmt> *)(local_4b8 + 0x10)
                           );
        std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_4b8 + 0x10));
        std::shared_ptr<kratos::AssignStmt>::~shared_ptr
                  ((shared_ptr<kratos::AssignStmt> *)local_4b8);
        std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::
        ~vector((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                 *)local_3c8);
        vars.
        super__Vector_base<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      }
      std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_3a8);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end3);
    }
    std::
    vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
    ::~vector((vector<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
               *)local_308);
    std::shared_ptr<kratos::Port>::~shared_ptr
              ((shared_ptr<kratos::Port> *)
               &blocks.
                super__Vector_base<std::shared_ptr<kratos::SequentialStmtBlock>,_std::allocator<std::shared_ptr<kratos::SequentialStmtBlock>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&clock_names.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           *)local_1d8);
  std::__cxx11::string::~string
            ((string *)
             &attributes.
              super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void visit(Generator* generator) override {
        // only if the generator has attribute of "pipeline" and the value string is the
        // number of pipeline stages will do
        bool has_attribute = false;
        std::string clock_name;
        auto attributes = generator->get_attributes();
        uint32_t num_stages = 0;
        for (auto const& attr : attributes) {
            if (attr->type_str == "pipeline") {
                try {
                    int i = std::stoi(attr->value_str);
                    if (i > 0) {
                        num_stages = static_cast<uint32_t>(i);
                        has_attribute = true;
                    }
                } catch (std::invalid_argument const&) {
                    throw std::runtime_error(
                        ::format("Unable to get value string from generator {0}", generator->name));
                }
            } else if (attr->type_str == "pipeline_clk") {
                clock_name = attr->value_str;
            }
        }
        if (has_attribute) {
            auto port_names = generator->get_port_names();
            // get the clock name, if it's empty
            if (clock_name.empty()) {
                // pick the first one
                auto clock_names = generator->get_ports(PortType::Clock);
                if (!clock_names.empty()) clock_name = clock_names[0];
            }
            if (clock_name.empty()) {
                throw GeneratorException(
                    ::format("Unable to find clock signal for generator {0}", generator->name),
                    {generator});
            }
            auto clock_port = generator->get_port(clock_name);
            // we need to create all the registers based on the posedge of the clock
            std::vector<std::shared_ptr<SequentialStmtBlock>> blocks;
            blocks.resize(num_stages);
            for (uint32_t i = 0; i < num_stages; i++) {
                blocks[i] = std::make_shared<SequentialStmtBlock>();
                generator->add_stmt(blocks[i]);
                blocks[i]->add_condition({EventEdgeType::Posedge, clock_port});
                if (generator->debug)
                    blocks[i]->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
            }
            // get all the outputs
            for (auto const& port_name : port_names) {
                auto port = generator->get_port(port_name);
                if (port->port_direction() == PortDirection::In) {
                    continue;
                }
                std::vector<std::shared_ptr<Var>> vars;
                vars.resize(num_stages);
                for (uint32_t i = 0; i < num_stages; i++) {
                    auto new_name =
                        generator->get_unique_variable_name(port_name, ::format("stage_{0}", i));
                    auto& var = generator->var(new_name, port->var_width(), port->size(),
                                               port->is_signed());
                    if (generator->debug)
                        var.fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
                    vars[i] = var.shared_from_this();
                }
                // move the source to the first stage
                Var::move_src_to(port.get(), vars[0].get(), generator, false);
                // connect the stages together
                for (uint32_t i = 0; i < num_stages - 1; i++) {
                    auto pre_stage = vars[i];
                    auto next_stage = vars[i + 1];
                    blocks[i]->add_stmt(next_stage->assign(pre_stage, AssignmentType::NonBlocking));
                }
                // last stage
                blocks[num_stages - 1]->add_stmt(
                    port->assign(vars[num_stages - 1], AssignmentType::NonBlocking));
            }
        }
    }